

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::GetImplibGNUtoMS
          (cmGeneratorTarget *this,string *config,string *gnuName,string *out,char *newExt)

{
  bool bVar1;
  char *local_70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = HasImplibGNUtoMS(this,config);
  if ((bVar1) && (6 < gnuName->_M_string_length)) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)gnuName);
    bVar1 = std::operator==(&local_48,".dll.a");
    std::__cxx11::string::~string((string *)&local_48);
    if (bVar1) {
      local_68._M_str = (gnuName->_M_dataplus)._M_p;
      local_68._M_len = gnuName->_M_string_length;
      local_58 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&local_68,0,local_68._M_len - 6);
      local_70 = ".lib";
      if (newExt != (char *)0x0) {
        local_70 = newExt;
      }
      cmStrCat<std::basic_string_view<char,std::char_traits<char>>,char_const*>
                (&local_48,&local_58,&local_70);
      std::__cxx11::string::operator=((string *)out,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      return true;
    }
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::GetImplibGNUtoMS(std::string const& config,
                                         std::string const& gnuName,
                                         std::string& out,
                                         const char* newExt) const
{
  if (this->HasImplibGNUtoMS(config) && gnuName.size() > 6 &&
      gnuName.substr(gnuName.size() - 6) == ".dll.a") {
    out = cmStrCat(cm::string_view(gnuName).substr(0, gnuName.size() - 6),
                   newExt ? newExt : ".lib");
    return true;
  }
  return false;
}